

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe40At6(uint8_t *buf)

{
  return (ulong)((uint)buf[3] | (uint)buf[4] << 8 | (buf[5] & 0x3f) << 0x10) << 0x12 |
         (ulong)((uint)buf[2] * 0x400 + (uint)buf[1] * 4) | (ulong)(*buf >> 6);
}

Assistant:

std::uint64_t readFlUIntLe40At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0xffffffffff);
    return res;
}